

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O0

quat quat_slerp(quat v0,quat v1,float a)

{
  float fVar1;
  float s;
  quat qVar2;
  quat qVar3;
  quat q2;
  quat v2;
  float theta;
  float theta_0;
  undefined4 local_60;
  float dot;
  undefined4 uStack_38;
  float a_local;
  quat v1_local;
  quat v0_local;
  undefined8 local_10;
  
  qVar2 = quat_normalize(v0);
  qVar3 = quat_normalize(v1);
  _uStack_38 = qVar3._0_8_;
  v1_local._0_8_ = qVar3._8_8_;
  local_60 = quat_dot(qVar2,qVar3);
  if (ABS(local_60) <= 0.95) {
    if (local_60 < 0.0) {
      qVar3 = quat_scale(qVar3,-1.0);
      _uStack_38 = qVar3._0_8_;
      v1_local._0_8_ = qVar3._8_8_;
      local_60 = -local_60;
    }
    if (local_60 <= -1.0) {
      local_60 = -1.0;
    }
    if (1.0 <= local_60) {
      local_60 = 1.0;
    }
    fVar1 = acosf(local_60);
    q2 = quat_scale(qVar2,a);
    qVar3.z = v1_local.x;
    qVar3.w = v1_local.y;
    qVar3.x = (float)uStack_38;
    qVar3.y = a_local;
    qVar3 = quat_subtract(qVar3,q2);
    qVar3 = quat_normalize(qVar3);
    s = cosf(fVar1 * a);
    qVar2 = quat_scale(qVar2,s);
    fVar1 = sinf(fVar1 * a);
    qVar3 = quat_scale(qVar3,fVar1);
    qVar2 = quat_add(qVar2,qVar3);
    v0_local._8_8_ = qVar2._0_8_;
    local_10 = qVar2._8_8_;
  }
  else {
    qVar3 = quat_subtract(qVar3,qVar2);
    qVar3 = quat_scale(qVar3,a);
    qVar2 = quat_add(qVar2,qVar3);
    v0_local._8_8_ = qVar2._0_8_;
    local_10 = qVar2._8_8_;
  }
  qVar2.z = (float)(undefined4)local_10;
  qVar2.w = (float)local_10._4_4_;
  qVar2.x = v0_local.z;
  qVar2.y = v0_local.w;
  return qVar2;
}

Assistant:

quat quat_slerp(quat v0, quat v1, float a) {
    v0 = quat_normalize(v0);
    v1 = quat_normalize(v1);

    float dot = quat_dot(v0, v1);
    if (fabs(dot) > 0.95f) {
        return quat_add(v0, quat_scale(quat_subtract(v1, v0), a));
    }

    if (dot < 0.0f) {
        v1 = quat_scale(v1, -1.0f);
        dot = -dot;
    }

    dot = fminf(fmaxf(-1.0f, dot), 1.0f);
    float theta_0 = acosf(dot);
    float theta = theta_0 * a;

    quat v2 = quat_subtract(v1, quat_scale(v0, a));
    v2 = quat_normalize(v2);

    return quat_add(quat_scale(v0, cosf(theta)), quat_scale(v2, sinf(theta)));
}